

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O2

bool __thiscall QOpenGLShaderProgram::addShader(QOpenGLShaderProgram *this,QOpenGLShader *shader)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QObject aQStack_58 [8];
  char local_50 [24];
  char *local_38;
  QOpenGLShader *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  local_30 = shader;
  iVar5 = init(this,(EVP_PKEY_CTX *)shader);
  if ((char)iVar5 != '\0') {
    bVar4 = QListSpecialMethodsBase<QOpenGLShader*>::contains<QOpenGLShader*>
                      ((QListSpecialMethodsBase<QOpenGLShader*> *)(lVar1 + 0xa0),&local_30);
    bVar6 = true;
    if (bVar4) goto LAB_00148c8b;
    lVar2 = *(long *)(lVar1 + 0x78);
    if (lVar2 != 0) {
      if (((local_30 != (QOpenGLShader *)0x0 && *(int *)(lVar2 + 0x10) != 0) &&
          (lVar3 = *(long *)(*(long *)&local_30->field_0x8 + 0x78), lVar3 != 0)) &&
         (*(int *)(lVar3 + 0x10) != 0)) {
        if (*(long *)(lVar2 + 8) == *(long *)(lVar3 + 8)) {
          (**(code **)(**(long **)(lVar1 + 0xd0) + 0x180))();
          *(undefined1 *)(lVar1 + 0x80) = 0;
          QList<QOpenGLShader_*>::append((QList<QOpenGLShader_*> *)(lVar1 + 0xa0),local_30);
          QObject::connect(aQStack_58,(char *)local_30,(QObject *)"2destroyed()",(char *)this,
                           0x179292);
          QMetaObject::Connection::~Connection((Connection *)aQStack_58);
        }
        else {
          local_50[0] = '\x02';
          local_50[1] = '\0';
          local_50[2] = '\0';
          local_50[3] = '\0';
          local_50[0x14] = '\0';
          local_50[0x15] = '\0';
          local_50[0x16] = '\0';
          local_50[0x17] = '\0';
          local_50[4] = '\0';
          local_50[5] = '\0';
          local_50[6] = '\0';
          local_50[7] = '\0';
          local_50[8] = '\0';
          local_50[9] = '\0';
          local_50[10] = '\0';
          local_50[0xb] = '\0';
          local_50[0xc] = '\0';
          local_50[0xd] = '\0';
          local_50[0xe] = '\0';
          local_50[0xf] = '\0';
          local_50[0x10] = '\0';
          local_50[0x11] = '\0';
          local_50[0x12] = '\0';
          local_50[0x13] = '\0';
          local_38 = "default";
          bVar6 = false;
          QMessageLogger::warning
                    (local_50,
                     "QOpenGLShaderProgram::addShader: Program and shader are not associated with same context."
                    );
        }
        goto LAB_00148c8b;
      }
    }
  }
  bVar6 = false;
LAB_00148c8b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLShaderProgram::addShader(QOpenGLShader *shader)
{
    Q_D(QOpenGLShaderProgram);
    if (!init())
        return false;
    if (d->shaders.contains(shader))
        return true;    // Already added to this shader program.
    if (d->programGuard && d->programGuard->id() && shader) {
        if (!shader->d_func()->shaderGuard || !shader->d_func()->shaderGuard->id())
            return false;
        if (d->programGuard->group() != shader->d_func()->shaderGuard->group()) {
            qWarning("QOpenGLShaderProgram::addShader: Program and shader are not associated with same context.");
            return false;
        }
        d->glfuncs->glAttachShader(d->programGuard->id(), shader->d_func()->shaderGuard->id());
        d->linked = false;  // Program needs to be relinked.
        d->shaders.append(shader);
        connect(shader, SIGNAL(destroyed()), this, SLOT(shaderDestroyed()));
        return true;
    } else {
        return false;
    }
}